

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

void __thiscall AddrManImpl::~AddrManImpl(AddrManImpl *this)

{
  FastRandomContext *in_RDI;
  long in_FS_OFFSET;
  vector<long,_std::allocator<long>_> *this_00;
  
  this_00 = *(vector<long,_std::allocator<long>_> **)(in_FS_OFFSET + 0x28);
  base_blob<256U>::SetNull((base_blob<256U> *)in_RDI);
  std::
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  ::~unordered_map((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                    *)in_RDI);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)in_RDI);
  std::vector<long,_std::allocator<long>_>::~vector(this_00);
  std::
  unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
  ::~unordered_map((unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
                    *)in_RDI);
  std::
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  ::~unordered_map((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                    *)in_RDI);
  FastRandomContext::~FastRandomContext(in_RDI);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin((AnnotatedMixin<std::mutex> *)in_RDI);
  if (*(vector<long,_std::allocator<long>_> **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

AddrManImpl::~AddrManImpl()
{
    nKey.SetNull();
}